

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,string *filename,bool noPolicyScope)

{
  bool bVar1;
  bool bVar2;
  cmValue cVar3;
  string *in_base;
  string_view value;
  string filenametoread;
  cmListFile listFile;
  IncludeScope incScope;
  string local_68;
  cmListFile local_48;
  IncludeScope local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&local_48);
  cVar3 = GetDefinition(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (cVar3.Value != (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&local_48);
    value._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar3.Value)->_M_string_length;
    AddDefinition(this,&local_68,value);
    std::__cxx11::string::~string((string *)&local_68);
  }
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&local_68,filename,in_base);
  IncludeScope::IncludeScope(&local_30,this,&local_68,noPolicyScope);
  local_48.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = cmListFile::ParseFile
                    (&local_48,local_68._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  if (bVar1) {
    RunListFile(this,&local_48,&local_68,(DeferCommands *)0x0);
    bVar2 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar2) {
      local_30.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_48.Functions)
  ;
  IncludeScope::~IncludeScope(&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadDependentFile(const std::string& filename,
                                   bool noPolicyScope)
{
  if (cmValue def = this->GetDefinition("CMAKE_CURRENT_LIST_FILE")) {
    this->AddDefinition("CMAKE_PARENT_LIST_FILE", *def);
  }
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    incScope.Quiet();
  }
  return true;
}